

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O2

int quicly_ranges_add(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  int iVar1;
  uint64_t *puVar2;
  size_t slot;
  size_t end_slot;
  long lVar3;
  bool bVar4;
  
  if (end < start) {
    __assert_fail("start <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                  ,0x65,"int quicly_ranges_add(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  if (start == end) {
    return 0;
  }
  slot = ranges->num_ranges;
  if (slot == 0) {
LAB_0012bc2e:
    slot = 0;
  }
  else {
    end_slot = slot - 1;
    if (start <= ranges->ranges[end_slot].end) {
      for (puVar2 = &ranges->ranges[slot - 1].end; end < ((quicly_range_t *)(puVar2 + -1))->start;
          puVar2 = puVar2 + -2) {
        bVar4 = end_slot == 0;
        end_slot = end_slot - 1;
        if (bVar4) goto LAB_0012bc2e;
      }
      slot = end_slot + 1;
      lVar3 = 0;
      while( true ) {
        if (*puVar2 == start) {
          slot = slot - 1;
          goto LAB_0012bc5e;
        }
        if (*puVar2 < start) break;
        lVar3 = lVar3 + 1;
        puVar2 = puVar2 + -2;
        slot = slot - 1;
        if (slot == 0) {
          slot = 0;
LAB_0012bc5e:
          merge_update(ranges,start,end,slot,end_slot);
          return 0;
        }
      }
      if (lVar3 == 0) goto LAB_0012bc30;
      goto LAB_0012bc5e;
    }
  }
LAB_0012bc30:
  iVar1 = insert_at(ranges,start,end,slot);
  return iVar1;
}

Assistant:

int quicly_ranges_add(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t slot, end_slot;

    assert(start <= end);

    if (start == end)
        return 0;

    if (ranges->num_ranges == 0) {
        return insert_at(ranges, start, end, 0);
    } else if (ranges->ranges[ranges->num_ranges - 1].end < start) {
        return insert_at(ranges, start, end, ranges->num_ranges);
    }

    /* find the slot that should contain `end` */
    for (slot = ranges->num_ranges - 1;; --slot) {
        if (ranges->ranges[slot].start <= end)
            break;
        if (slot == 0)
            return insert_at(ranges, start, end, 0);
    }
    end_slot = slot;

    /* find the slot that should contain `start` */
    do {
        if (ranges->ranges[slot].end == start) {
            return merge_update(ranges, start, end, slot, end_slot);
        } else if (ranges->ranges[slot].end < start) {
            if (slot++ == end_slot) {
                return insert_at(ranges, start, end, slot);
            } else {
                return merge_update(ranges, start, end, slot, end_slot);
            }
        }
    } while (slot-- != 0);

    return merge_update(ranges, start, end, 0, end_slot);
}